

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool isNormInert(BinaryProperty *param_1,UChar32 c,UProperty which)

{
  UBool UVar1;
  int iVar2;
  Normalizer2 *pNVar3;
  bool local_29;
  Normalizer2 *norm2;
  UProperty local_18;
  UErrorCode errorCode;
  UProperty which_local;
  UChar32 c_local;
  BinaryProperty *param_0_local;
  
  norm2._4_4_ = U_ZERO_ERROR;
  local_18 = which;
  errorCode = c;
  _which_local = param_1;
  pNVar3 = icu_63::Normalizer2Factory::getInstance(which - 0x23,(UErrorCode *)((long)&norm2 + 4));
  UVar1 = U_SUCCESS(norm2._4_4_);
  local_29 = false;
  if (UVar1 != '\0') {
    iVar2 = (*(pNVar3->super_UObject)._vptr_UObject[0x11])(pNVar3,(ulong)(uint)errorCode);
    local_29 = (char)iVar2 != '\0';
  }
  return local_29;
}

Assistant:

static UBool isNormInert(const BinaryProperty &/*prop*/, UChar32 c, UProperty which) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *norm2=Normalizer2Factory::getInstance(
        (UNormalizationMode)(which-UCHAR_NFD_INERT+UNORM_NFD), errorCode);
    return U_SUCCESS(errorCode) && norm2->isInert(c);
}